

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

char * ma_channel_position_to_string(ma_channel channel)

{
  ma_channel channel_local;
  char *local_8;
  
  switch(channel) {
  case '\0':
    local_8 = "CHANNEL_NONE";
    break;
  case '\x01':
    local_8 = "CHANNEL_MONO";
    break;
  case '\x02':
    local_8 = "CHANNEL_FRONT_LEFT";
    break;
  case '\x03':
    local_8 = "CHANNEL_FRONT_RIGHT";
    break;
  case '\x04':
    local_8 = "CHANNEL_FRONT_CENTER";
    break;
  case '\x05':
    local_8 = "CHANNEL_LFE";
    break;
  case '\x06':
    local_8 = "CHANNEL_BACK_LEFT";
    break;
  case '\a':
    local_8 = "CHANNEL_BACK_RIGHT";
    break;
  case '\b':
    local_8 = "CHANNEL_FRONT_LEFT_CENTER";
    break;
  case '\t':
    local_8 = "CHANNEL_FRONT_RIGHT_CENTER";
    break;
  case '\n':
    local_8 = "CHANNEL_BACK_CENTER";
    break;
  case '\v':
    local_8 = "CHANNEL_SIDE_LEFT";
    break;
  case '\f':
    local_8 = "CHANNEL_SIDE_RIGHT";
    break;
  case '\r':
    local_8 = "CHANNEL_TOP_CENTER";
    break;
  case '\x0e':
    local_8 = "CHANNEL_TOP_FRONT_LEFT";
    break;
  case '\x0f':
    local_8 = "CHANNEL_TOP_FRONT_CENTER";
    break;
  case '\x10':
    local_8 = "CHANNEL_TOP_FRONT_RIGHT";
    break;
  case '\x11':
    local_8 = "CHANNEL_TOP_BACK_LEFT";
    break;
  case '\x12':
    local_8 = "CHANNEL_TOP_BACK_CENTER";
    break;
  case '\x13':
    local_8 = "CHANNEL_TOP_BACK_RIGHT";
    break;
  case '\x14':
    local_8 = "CHANNEL_AUX_0";
    break;
  case '\x15':
    local_8 = "CHANNEL_AUX_1";
    break;
  case '\x16':
    local_8 = "CHANNEL_AUX_2";
    break;
  case '\x17':
    local_8 = "CHANNEL_AUX_3";
    break;
  case '\x18':
    local_8 = "CHANNEL_AUX_4";
    break;
  case '\x19':
    local_8 = "CHANNEL_AUX_5";
    break;
  case '\x1a':
    local_8 = "CHANNEL_AUX_6";
    break;
  case '\x1b':
    local_8 = "CHANNEL_AUX_7";
    break;
  case '\x1c':
    local_8 = "CHANNEL_AUX_8";
    break;
  case '\x1d':
    local_8 = "CHANNEL_AUX_9";
    break;
  case '\x1e':
    local_8 = "CHANNEL_AUX_10";
    break;
  case '\x1f':
    local_8 = "CHANNEL_AUX_11";
    break;
  case ' ':
    local_8 = "CHANNEL_AUX_12";
    break;
  case '!':
    local_8 = "CHANNEL_AUX_13";
    break;
  case '\"':
    local_8 = "CHANNEL_AUX_14";
    break;
  case '#':
    local_8 = "CHANNEL_AUX_15";
    break;
  case '$':
    local_8 = "CHANNEL_AUX_16";
    break;
  case '%':
    local_8 = "CHANNEL_AUX_17";
    break;
  case '&':
    local_8 = "CHANNEL_AUX_18";
    break;
  case '\'':
    local_8 = "CHANNEL_AUX_19";
    break;
  case '(':
    local_8 = "CHANNEL_AUX_20";
    break;
  case ')':
    local_8 = "CHANNEL_AUX_21";
    break;
  case '*':
    local_8 = "CHANNEL_AUX_22";
    break;
  case '+':
    local_8 = "CHANNEL_AUX_23";
    break;
  case ',':
    local_8 = "CHANNEL_AUX_24";
    break;
  case '-':
    local_8 = "CHANNEL_AUX_25";
    break;
  case '.':
    local_8 = "CHANNEL_AUX_26";
    break;
  case '/':
    local_8 = "CHANNEL_AUX_27";
    break;
  case '0':
    local_8 = "CHANNEL_AUX_28";
    break;
  case '1':
    local_8 = "CHANNEL_AUX_29";
    break;
  case '2':
    local_8 = "CHANNEL_AUX_30";
    break;
  case '3':
    local_8 = "CHANNEL_AUX_31";
    break;
  default:
    local_8 = "UNKNOWN";
  }
  return local_8;
}

Assistant:

MA_API const char* ma_channel_position_to_string(ma_channel channel)
{
    switch (channel)
    {
        case MA_CHANNEL_NONE              : return "CHANNEL_NONE";
        case MA_CHANNEL_MONO              : return "CHANNEL_MONO";
        case MA_CHANNEL_FRONT_LEFT        : return "CHANNEL_FRONT_LEFT";
        case MA_CHANNEL_FRONT_RIGHT       : return "CHANNEL_FRONT_RIGHT";
        case MA_CHANNEL_FRONT_CENTER      : return "CHANNEL_FRONT_CENTER";
        case MA_CHANNEL_LFE               : return "CHANNEL_LFE";
        case MA_CHANNEL_BACK_LEFT         : return "CHANNEL_BACK_LEFT";
        case MA_CHANNEL_BACK_RIGHT        : return "CHANNEL_BACK_RIGHT";
        case MA_CHANNEL_FRONT_LEFT_CENTER : return "CHANNEL_FRONT_LEFT_CENTER";
        case MA_CHANNEL_FRONT_RIGHT_CENTER: return "CHANNEL_FRONT_RIGHT_CENTER";
        case MA_CHANNEL_BACK_CENTER       : return "CHANNEL_BACK_CENTER";
        case MA_CHANNEL_SIDE_LEFT         : return "CHANNEL_SIDE_LEFT";
        case MA_CHANNEL_SIDE_RIGHT        : return "CHANNEL_SIDE_RIGHT";
        case MA_CHANNEL_TOP_CENTER        : return "CHANNEL_TOP_CENTER";
        case MA_CHANNEL_TOP_FRONT_LEFT    : return "CHANNEL_TOP_FRONT_LEFT";
        case MA_CHANNEL_TOP_FRONT_CENTER  : return "CHANNEL_TOP_FRONT_CENTER";
        case MA_CHANNEL_TOP_FRONT_RIGHT   : return "CHANNEL_TOP_FRONT_RIGHT";
        case MA_CHANNEL_TOP_BACK_LEFT     : return "CHANNEL_TOP_BACK_LEFT";
        case MA_CHANNEL_TOP_BACK_CENTER   : return "CHANNEL_TOP_BACK_CENTER";
        case MA_CHANNEL_TOP_BACK_RIGHT    : return "CHANNEL_TOP_BACK_RIGHT";
        case MA_CHANNEL_AUX_0             : return "CHANNEL_AUX_0";
        case MA_CHANNEL_AUX_1             : return "CHANNEL_AUX_1";
        case MA_CHANNEL_AUX_2             : return "CHANNEL_AUX_2";
        case MA_CHANNEL_AUX_3             : return "CHANNEL_AUX_3";
        case MA_CHANNEL_AUX_4             : return "CHANNEL_AUX_4";
        case MA_CHANNEL_AUX_5             : return "CHANNEL_AUX_5";
        case MA_CHANNEL_AUX_6             : return "CHANNEL_AUX_6";
        case MA_CHANNEL_AUX_7             : return "CHANNEL_AUX_7";
        case MA_CHANNEL_AUX_8             : return "CHANNEL_AUX_8";
        case MA_CHANNEL_AUX_9             : return "CHANNEL_AUX_9";
        case MA_CHANNEL_AUX_10            : return "CHANNEL_AUX_10";
        case MA_CHANNEL_AUX_11            : return "CHANNEL_AUX_11";
        case MA_CHANNEL_AUX_12            : return "CHANNEL_AUX_12";
        case MA_CHANNEL_AUX_13            : return "CHANNEL_AUX_13";
        case MA_CHANNEL_AUX_14            : return "CHANNEL_AUX_14";
        case MA_CHANNEL_AUX_15            : return "CHANNEL_AUX_15";
        case MA_CHANNEL_AUX_16            : return "CHANNEL_AUX_16";
        case MA_CHANNEL_AUX_17            : return "CHANNEL_AUX_17";
        case MA_CHANNEL_AUX_18            : return "CHANNEL_AUX_18";
        case MA_CHANNEL_AUX_19            : return "CHANNEL_AUX_19";
        case MA_CHANNEL_AUX_20            : return "CHANNEL_AUX_20";
        case MA_CHANNEL_AUX_21            : return "CHANNEL_AUX_21";
        case MA_CHANNEL_AUX_22            : return "CHANNEL_AUX_22";
        case MA_CHANNEL_AUX_23            : return "CHANNEL_AUX_23";
        case MA_CHANNEL_AUX_24            : return "CHANNEL_AUX_24";
        case MA_CHANNEL_AUX_25            : return "CHANNEL_AUX_25";
        case MA_CHANNEL_AUX_26            : return "CHANNEL_AUX_26";
        case MA_CHANNEL_AUX_27            : return "CHANNEL_AUX_27";
        case MA_CHANNEL_AUX_28            : return "CHANNEL_AUX_28";
        case MA_CHANNEL_AUX_29            : return "CHANNEL_AUX_29";
        case MA_CHANNEL_AUX_30            : return "CHANNEL_AUX_30";
        case MA_CHANNEL_AUX_31            : return "CHANNEL_AUX_31";
        default: break;
    }

    return "UNKNOWN";
}